

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool __thiscall ON_Brep::HasSlits(ON_Brep *this,ON_BrepFace *F)

{
  bool bVar1;
  ON_BrepLoop *L;
  int lti;
  int t1;
  int t0;
  int local_30;
  int local_2c;
  
  if ((-1 < F->m_face_index) && (lti = 0, 0 < (F->m_li).m_count)) {
    do {
      L = ON_BrepFace::Loop(F,lti);
      if ((L != (ON_BrepLoop *)0x0) && (-1 < L->m_loop_index)) {
        if (L->m_type == slit) {
          return true;
        }
        bVar1 = FoundSlitPair(L,&local_2c,&local_30);
        if (bVar1) {
          return true;
        }
      }
      lti = lti + 1;
    } while (lti < (F->m_li).m_count);
  }
  return false;
}

Assistant:

bool ON_Brep::HasSlits(const ON_BrepFace& F) const

{
  if (F.m_face_index < 0)
    return false;
  int i;
  for (i=0; i<F.m_li.Count(); i++){
    const ON_BrepLoop* pL = F.Loop(i);
    if (!pL)
      continue;
    if (HasSlits(*pL))
      return true;
  }
  return false;
}